

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  u16 *puVar1;
  int iVar2;
  sqlite3 *db;
  sqlite3 *psVar3;
  Db *pDVar4;
  Index *pIVar5;
  Schema *pSVar6;
  byte bVar7;
  int iDb;
  int iVar8;
  int iVar9;
  uint p2;
  Table *pTVar10;
  VTable *pVVar11;
  Vdbe *pVVar12;
  Trigger *pTrigger;
  FKey *pFVar13;
  FKey **ppFVar14;
  SrcList *pTabList;
  Index **ppIVar15;
  char *pcVar16;
  int iTable;
  int iVar17;
  char *pcVar18;
  HashElem *pHVar19;
  
  db = pParse->db;
  if (db->mallocFailed != '\0') goto LAB_0016257e;
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + '\x01';
  }
  pTVar10 = sqlite3LocateTableItem(pParse,isView,pName->a);
  if (noErr == 0) {
    if (pTVar10 == (Table *)0x0) goto LAB_0016257e;
  }
  else {
    db->suppressErr = db->suppressErr + 0xff;
    if (pTVar10 == (Table *)0x0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      goto LAB_0016257e;
    }
  }
  iDb = sqlite3SchemaToIndex(db,pTVar10->pSchema);
  if (((pTVar10->tabFlags & 0x10) != 0) &&
     (iVar8 = sqlite3ViewGetColumnNames(pParse,pTVar10), iVar8 != 0)) goto LAB_0016257e;
  pcVar16 = "sqlite_master";
  if (iDb == 1) {
    pcVar16 = "sqlite_temp_master";
  }
  pcVar18 = db->aDb[iDb].zName;
  iVar8 = sqlite3AuthCheck(pParse,9,pcVar16,(char *)0x0,pcVar18);
  if (iVar8 != 0) goto LAB_0016257e;
  if (isView == 0) {
    if ((pTVar10->tabFlags & 0x10) == 0) {
      iVar8 = (uint)(iDb == 1) * 2 + 0xb;
      goto LAB_00162680;
    }
    pVVar11 = sqlite3GetVTable(db,pTVar10);
    pcVar16 = pVVar11->pMod->zName;
    iVar8 = 0x1e;
  }
  else {
    iVar8 = (uint)(iDb != 1) * 2 + 0xf;
LAB_00162680:
    pcVar16 = (char *)0x0;
  }
  iVar8 = sqlite3AuthCheck(pParse,iVar8,pTVar10->zName,pcVar16,pcVar18);
  if ((iVar8 != 0) ||
     (iVar8 = sqlite3AuthCheck(pParse,9,pTVar10->zName,(char *)0x0,pcVar18), iVar8 != 0))
  goto LAB_0016257e;
  pcVar16 = pTVar10->zName;
  iVar8 = sqlite3_strnicmp(pcVar16,"sqlite_",7);
  if ((iVar8 == 0) && (iVar8 = sqlite3_strnicmp(pcVar16,"sqlite_stat",0xb), iVar8 != 0)) {
    pcVar18 = "table %s may not be dropped";
  }
  else if (isView == 0) {
    if (pTVar10->pSelect == (Select *)0x0) goto LAB_0016273c;
    pcVar18 = "use DROP VIEW to delete view %s";
  }
  else {
    if (pTVar10->pSelect != (Select *)0x0) {
LAB_0016273c:
      pVVar12 = sqlite3GetVdbe(pParse);
      if (pVVar12 != (Vdbe *)0x0) {
        sqlite3BeginWriteOperation(pParse,1,iDb);
        sqlite3ClearStatTables(pParse,iDb,"tbl",pTVar10->zName);
        psVar3 = pParse->db;
        if ((((psVar3->flags & 0x40000) != 0) && ((pTVar10->tabFlags & 0x10) == 0)) &&
           (pTVar10->pSelect == (Select *)0x0)) {
          pVVar12 = sqlite3GetVdbe(pParse);
          pFVar13 = sqlite3FkReferences(pTVar10);
          p2 = 0;
          if (pFVar13 == (FKey *)0x0) {
            ppFVar14 = &pTVar10->pFKey;
            do {
              pFVar13 = *ppFVar14;
              if (pFVar13 == (FKey *)0x0) goto LAB_00162790;
              ppFVar14 = &pFVar13->pNextFrom;
            } while (pFVar13->isDeferred == '\0');
            p2 = sqlite3VdbeMakeLabel(pVVar12);
            sqlite3VdbeAddOp2(pVVar12,0x76,1,p2);
          }
          pParse->disableTriggers = '\x01';
          pTabList = sqlite3SrcListDup(psVar3,pName,0);
          sqlite3DeleteFrom(pParse,pTabList,(Expr *)0x0);
          pParse->disableTriggers = '\0';
          sqlite3VdbeAddOp2(pVVar12,0x76,0,pVVar12->nOp + 2);
          sqlite3HaltConstraint(pParse,0x313,2,"foreign key constraint failed",-2);
          if ((p2 != 0) && (pVVar12->aLabel != (int *)0x0)) {
            pVVar12->aLabel[(int)~p2] = pVVar12->nOp;
          }
        }
LAB_00162790:
        psVar3 = pParse->db;
        pDVar4 = psVar3->aDb;
        pVVar12 = sqlite3GetVdbe(pParse);
        sqlite3BeginWriteOperation(pParse,1,iDb);
        if ((pTVar10->tabFlags & 0x10) != 0) {
          sqlite3VdbeAddOp0(pVVar12,0x84);
        }
        for (pTrigger = sqlite3TriggerList(pParse,pTVar10); pTrigger != (Trigger *)0x0;
            pTrigger = pTrigger->pNext) {
          sqlite3DropTriggerPtr(pParse,pTrigger);
        }
        if ((pTVar10->tabFlags & 8) != 0) {
          sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",pDVar4[iDb].zName
                             ,pTVar10->zName);
        }
        sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE tbl_name=%Q and type!=\'trigger\'",
                           pDVar4[iDb].zName);
        bVar7 = pTVar10->tabFlags;
        if ((isView == 0) && ((bVar7 & 0x10) == 0)) {
          iVar8 = pTVar10->tnum;
          iVar9 = 0;
          while( true ) {
            iTable = 0;
            if (iVar8 < iVar9) {
              iTable = iVar8;
            }
            ppIVar15 = &pTVar10->pIndex;
            if (iVar9 == 0) {
              iTable = iVar8;
            }
            while (pIVar5 = *ppIVar15, pIVar5 != (Index *)0x0) {
              iVar2 = pIVar5->tnum;
              iVar17 = iTable;
              if (iTable < iVar2) {
                iVar17 = iVar2;
              }
              if (iVar2 < iVar9) {
                iTable = iVar17;
              }
              if (iVar9 == 0) {
                iTable = iVar17;
              }
              ppIVar15 = &pIVar5->pNext;
            }
            if (iTable == 0) break;
            iVar9 = sqlite3SchemaToIndex(pParse->db,pTVar10->pSchema);
            destroyRootPage(pParse,iTable,iVar9);
            iVar9 = iTable;
          }
          bVar7 = pTVar10->tabFlags;
        }
        if ((bVar7 & 0x10) != 0) {
          sqlite3VdbeAddOp4(pVVar12,0x86,iDb,0,0,pTVar10->zName,0);
        }
        sqlite3VdbeAddOp4(pVVar12,0x6c,iDb,0,0,pTVar10->zName,0);
        sqlite3ChangeCookie(pParse,iDb);
        pSVar6 = psVar3->aDb[iDb].pSchema;
        if ((pSVar6->flags & 2) != 0) {
          pHVar19 = (HashElem *)&(pSVar6->tblHash).first;
          while (pHVar19 = pHVar19->next, pHVar19 != (HashElem *)0x0) {
            pTVar10 = (Table *)pHVar19->data;
            if (pTVar10->pSelect != (Select *)0x0) {
              sqliteDeleteColumnNames(psVar3,pTVar10);
              pTVar10->aCol = (Column *)0x0;
              pTVar10->nCol = 0;
            }
          }
          puVar1 = &(psVar3->aDb[iDb].pSchema)->flags;
          *puVar1 = *puVar1 & 0xfffd;
        }
      }
      goto LAB_0016257e;
    }
    pcVar18 = "use DROP TABLE to delete table %s";
  }
  sqlite3ErrorMsg(pParse,pcVar18,pcVar16);
LAB_0016257e:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( noErr ) db->suppressErr++;
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ) sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
    && sqlite3StrNICmp(pTab->zName, "sqlite_stat", 11)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && pTab->pSelect==0 ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the master table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
    sqlite3FkDropTable(pParse, pName, pTab);
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}